

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O3

void __thiscall ArgTest_PointerArg_Test::TestBody(ArgTest_PointerArg_Test *this)

{
  mock_visitor<const_void_*> *pmVar1;
  MockSpec<test_result_(const_void_*)> *pMVar2;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  arg;
  StrictMock<mock_visitor<const_void_*>_> visitor;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  local_f8;
  StrictMock<mock_visitor<const_void_*>_> local_d8;
  
  testing::StrictMock<mock_visitor<const_void_*>_>::StrictMock(&local_d8);
  testing::Matcher<const_void_*>::Matcher((Matcher<const_void_*> *)&local_f8,(void *)0x0);
  pmVar1 = &local_d8.super_mock_visitor<const_void_*>;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pmVar1,pmVar1);
  pMVar2 = testing::internal::FunctionMocker<test_result_(const_void_*)>::With
                     (&pmVar1->gmock1_visit_268,(Matcher<const_void_*> *)&local_f8);
  testing::internal::MockSpec<test_result_(const_void_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x176,"visitor","visit(cp)");
  local_f8.value_.field_0.double_value = (double)&PTR__MatcherBase_001d40f8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_void_*>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<const_void_*>_> *)
             ((long)&local_f8.value_.field_0 + 8));
  local_f8.type_ = pointer_type;
  local_f8.value_.field_0.long_long_value = 0;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<void_const*>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (&local_d8,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)&local_f8);
  testing::StrictMock<mock_visitor<const_void_*>_>::~StrictMock(&local_d8);
  testing::StrictMock<mock_visitor<const_void_*>_>::StrictMock(&local_d8);
  testing::Matcher<const_void_*>::Matcher((Matcher<const_void_*> *)&local_f8,(void *)0x0);
  pmVar1 = &local_d8.super_mock_visitor<const_void_*>;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pmVar1,pmVar1);
  pMVar2 = testing::internal::FunctionMocker<test_result_(const_void_*)>::With
                     (&pmVar1->gmock1_visit_268,(Matcher<const_void_*> *)&local_f8);
  testing::internal::MockSpec<test_result_(const_void_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x177,"visitor","visit(cp)");
  local_f8.value_.field_0.double_value = (double)&PTR__MatcherBase_001d40f8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_void_*>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<const_void_*>_> *)
             ((long)&local_f8.value_.field_0 + 8));
  local_f8.type_ = pointer_type;
  local_f8.value_.field_0.long_long_value = 0;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<void_const*>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (&local_d8,&local_f8);
  testing::StrictMock<mock_visitor<const_void_*>_>::~StrictMock(&local_d8);
  testing::StrictMock<mock_visitor<const_void_*>_>::StrictMock(&local_d8);
  testing::Matcher<const_void_*>::Matcher((Matcher<const_void_*> *)&local_f8,(void *)0x0);
  pmVar1 = &local_d8.super_mock_visitor<const_void_*>;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pmVar1,pmVar1);
  pMVar2 = testing::internal::FunctionMocker<test_result_(const_void_*)>::With
                     (&pmVar1->gmock1_visit_268,(Matcher<const_void_*> *)&local_f8);
  testing::internal::MockSpec<test_result_(const_void_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x178,"visitor","visit(expected)");
  local_f8.value_.field_0.double_value = (double)&PTR__MatcherBase_001d40f8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_void_*>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<const_void_*>_> *)
             ((long)&local_f8.value_.field_0 + 8));
  local_f8.type_ = pointer_type;
  local_f8.value_.field_0.long_long_value = 0;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<void_const*>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (&local_d8,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)&local_f8);
  testing::StrictMock<mock_visitor<const_void_*>_>::~StrictMock(&local_d8);
  testing::StrictMock<mock_visitor<const_void_*>_>::StrictMock(&local_d8);
  testing::Matcher<const_void_*>::Matcher((Matcher<const_void_*> *)&local_f8,(void *)0x0);
  pmVar1 = &local_d8.super_mock_visitor<const_void_*>;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pmVar1,pmVar1);
  pMVar2 = testing::internal::FunctionMocker<test_result_(const_void_*)>::With
                     (&pmVar1->gmock1_visit_268,(Matcher<const_void_*> *)&local_f8);
  testing::internal::MockSpec<test_result_(const_void_*)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x178,"visitor","visit(expected)");
  local_f8.value_.field_0.double_value = (double)&PTR__MatcherBase_001d40f8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_void_*>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<const_void_*>_> *)
             ((long)&local_f8.value_.field_0 + 8));
  local_f8.type_ = pointer_type;
  local_f8.value_.field_0.long_long_value = 0;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<void_const*>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (&local_d8,&local_f8);
  testing::StrictMock<mock_visitor<const_void_*>_>::~StrictMock(&local_d8);
  return;
}

Assistant:

TEST(ArgTest, PointerArg) {
  void *p = FMT_NULL;
  const void *cp = FMT_NULL;
  CHECK_ARG_(char, cp, p);
  CHECK_ARG_(wchar_t, cp, p);
  CHECK_ARG(cp, );
}